

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O3

ByteString * OSSL::pt2ByteString(ByteString *__return_storage_ptr__,EC_POINT *pt,EC_GROUP *grp)

{
  size_t newSize;
  uchar *buf;
  ByteString raw;
  ByteString local_48;
  
  ByteString::ByteString(&local_48);
  if (pt == (EC_POINT *)0x0 || grp == (EC_GROUP *)0x0) {
    ByteString::ByteString(__return_storage_ptr__,&local_48);
  }
  else {
    newSize = EC_POINT_point2oct((EC_GROUP *)grp,(EC_POINT *)pt,POINT_CONVERSION_UNCOMPRESSED,
                                 (uchar *)0x0,0,(BN_CTX *)0x0);
    ByteString::resize(&local_48,newSize);
    buf = ByteString::operator[](&local_48,0);
    EC_POINT_point2oct((EC_GROUP *)grp,(EC_POINT *)pt,POINT_CONVERSION_UNCOMPRESSED,buf,newSize,
                       (BN_CTX *)0x0);
    DERUTIL::raw2Octet(__return_storage_ptr__,&local_48);
  }
  local_48._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_48.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ByteString OSSL::pt2ByteString(const EC_POINT* pt, const EC_GROUP* grp)
{
	ByteString raw;

	if (pt == NULL || grp == NULL)
		return raw;

	size_t len = EC_POINT_point2oct(grp, pt, POINT_CONVERSION_UNCOMPRESSED, NULL, 0, NULL);
	raw.resize(len);
	EC_POINT_point2oct(grp, pt, POINT_CONVERSION_UNCOMPRESSED, &raw[0], len, NULL);

	return DERUTIL::raw2Octet(raw);
}